

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O2

bool __thiscall
Diligent::Serializer<(Diligent::SerializerMode)0>::
SerializeArray<Diligent::ImmutableSamplerDesc_const*,unsigned_int,bool(*)(Diligent::Serializer<(Diligent::SerializerMode)0>&,Diligent::ImmutableSamplerDesc&)>
          (Serializer<(Diligent::SerializerMode)0> *this,DynamicLinearAllocator *Allocator,
          ImmutableSamplerDesc **DstArray,uint *Count,
          _func_bool_Serializer<(Diligent::SerializerMode)0>_ptr_ImmutableSamplerDesc_ptr
          *ElemSerializer)

{
  TEnable<unsigned_int> TVar1;
  bool bVar2;
  ImmutableSamplerDesc *pIVar3;
  char (*Args_1) [20];
  ulong uVar4;
  ImmutableSamplerDesc *pIVar5;
  string msg;
  
  Args_1 = (char (*) [20])Count;
  if (Allocator == (DynamicLinearAllocator *)0x0) {
    FormatString<char[26],char[21]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x66d7eb,
               (char (*) [21])Count);
    Args_1 = (char (*) [20])0x1d3;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SerializeArray",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Serializer.hpp"
               ,0x1d3);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (*DstArray != (ImmutableSamplerDesc *)0x0) {
    FormatString<char[26],char[20]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"DstArray == nullptr",
               Args_1);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SerializeArray",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Serializer.hpp"
               ,0x1d4);
    std::__cxx11::string::~string((string *)&msg);
  }
  TVar1 = Serialize<unsigned_int>(this,Count);
  if (TVar1) {
    pIVar3 = DynamicLinearAllocator::ConstructArray<Diligent::ImmutableSamplerDesc>
                       (Allocator,(ulong)*Count);
    uVar4 = 0xffffffffffffffff;
    pIVar5 = pIVar3;
    do {
      uVar4 = uVar4 + 1;
      if (*Count <= uVar4) {
        *DstArray = pIVar3;
        return true;
      }
      bVar2 = (*ElemSerializer)(this,pIVar5);
      pIVar5 = pIVar5 + 1;
    } while (bVar2);
  }
  return false;
}

Assistant:

bool Serializer<SerializerMode::Read>::SerializeArray(DynamicLinearAllocator* Allocator,
                                                      ElemPtrType&            DstArray,
                                                      CountType&              Count,
                                                      ArrayElemSerializerType ElemSerializer)
{
    VERIFY_EXPR(Allocator != nullptr);
    VERIFY_EXPR(DstArray == nullptr);

    if (!(*this)(Count))
        return false;

    auto* pDstElements = Allocator->ConstructArray<RawType<decltype(DstArray[0])>>(Count);
    for (size_t i = 0; i < static_cast<size_t>(Count); ++i)
    {
        if (!ElemSerializer(*this, pDstElements[i]))
            return false;
    }
    DstArray = pDstElements;

    return true;
}